

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptRegExp::GetSetterBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,PropertyValueInfo *info,
          DescriptorFlags *result)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  DescriptorFlags DVar3;
  ScriptConfiguration *scriptConfig;
  DescriptorFlags *result_local;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  JavascriptRegExp *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetConfig(this_00);
  if ((propertyId != 0x153) && (propertyId != 0x1a0)) {
    if (propertyId == 0x1a2) {
      PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
      BVar2 = IsWritable(this,0x1a2);
      DVar3 = Data;
      if (BVar2 != 0) {
        DVar3 = WritableData;
      }
      *result = DVar3;
      return true;
    }
    if (propertyId != 0x1a3) {
      if (propertyId == 0x1a4) {
        bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_01);
        if ((bVar1) &&
           (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), !bVar1)) {
          PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
          BVar2 = IsWritable(this,0x1a4);
          DVar3 = Data;
          if (BVar2 != 0) {
            DVar3 = WritableData;
          }
          *result = DVar3;
          return true;
        }
        return false;
      }
      if (propertyId != 0x1a5) {
        if (propertyId == 0x1a6) {
          bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
          if ((bVar1) &&
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), !bVar1)) {
            PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
            BVar2 = IsWritable(this,0x1a6);
            DVar3 = Data;
            if (BVar2 != 0) {
              DVar3 = WritableData;
            }
            *result = DVar3;
            return true;
          }
          return false;
        }
        if (propertyId == 0x1a7) {
          bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(this_01);
          if ((bVar1) &&
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), !bVar1)) {
            PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
            BVar2 = IsWritable(this,0x1a7);
            DVar3 = Data;
            if (BVar2 != 0) {
              DVar3 = WritableData;
            }
            *result = DVar3;
            return true;
          }
          return false;
        }
        if (propertyId != 0x1e0) {
          return false;
        }
      }
    }
  }
  bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
    BVar2 = IsWritable(this,propertyId);
    DVar3 = Data;
    if (BVar2 != 0) {
      DVar3 = WritableData;
    }
    *result = DVar3;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool JavascriptRegExp::GetSetterBuiltIns(PropertyId propertyId, PropertyValueInfo* info, DescriptorFlags* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define GET_SETTER(ownProperty) \
        if (ownProperty) \
        { \
            PropertyValueInfo::SetNoCache(info, this); \
            *result = JavascriptRegExp::IsWritable(propertyId) ? WritableData : Data; \
            return true; \
        } \
        return false;

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            GET_SETTER(true);
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            GET_SETTER(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            GET_SETTER(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            GET_SETTER(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            GET_SETTER(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return false;
        }

#undef GET_SETTER
    }